

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLsDQJac(sunrealtype t,sunrealtype c_j,N_Vector y,N_Vector yp,N_Vector r,SUNMatrix Jac,
              void *ida_mem,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  int iVar1;
  long in_RCX;
  IDAMem in_R8;
  IDAMem IDA_mem;
  int retval;
  N_Vector in_stack_00000060;
  N_Vector in_stack_00000068;
  sunrealtype in_stack_00000080;
  N_Vector in_stack_000000f8;
  IDAMem in_stack_00000100;
  SUNMatrix in_stack_00000108;
  N_Vector in_stack_00000110;
  N_Vector in_stack_00000118;
  N_Vector in_stack_00000120;
  sunrealtype in_stack_00000128;
  sunrealtype in_stack_00000130;
  N_Vector in_stack_00000140;
  N_Vector in_stack_00000148;
  int local_4c;
  int local_4;
  
  if (in_R8 == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x3ad,"idaLsDQJac",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RCX == 0) {
    IDAProcessError(in_R8,-2,0x3b5,"idaLsDQJac",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else if ((((in_R8->ida_tempv1->ops->nvcloneempty == (_func_N_Vector_N_Vector *)0x0) ||
            (in_R8->ida_tempv1->ops->nvlinearsum ==
             (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
           (in_R8->ida_tempv1->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
          (((in_R8->ida_tempv1->ops->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
            (in_R8->ida_tempv1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0)) ||
           (in_R8->ida_tempv1->ops->nvsetarraypointer == (_func_void_sunrealtype_ptr_N_Vector *)0x0)
           ))) {
    IDAProcessError(in_R8,-3,0x3c2,"idaLsDQJac",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"A required vector operation is not implemented.");
    local_4 = -3;
  }
  else {
    iVar1 = SUNMatGetID(in_RCX);
    if (iVar1 == 0) {
      local_4c = idaLsDenseDQJac(in_stack_00000080,(sunrealtype)tmp3,tmp2,in_stack_00000068,
                                 in_stack_00000060,(SUNMatrix)t,(IDAMem)c_j,y);
    }
    else {
      iVar1 = SUNMatGetID(in_RCX);
      if (iVar1 == 3) {
        local_4c = idaLsBandDQJac(in_stack_00000130,in_stack_00000128,in_stack_00000120,
                                  in_stack_00000118,in_stack_00000110,in_stack_00000108,
                                  in_stack_00000100,in_stack_000000f8,in_stack_00000140,
                                  in_stack_00000148);
      }
      else {
        IDAProcessError(in_R8,-0x16,0x3d2,"idaLsDQJac",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                        ,"unrecognized matrix type for idaLsDQJac");
        local_4c = -0x16;
      }
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

int idaLsDQJac(sunrealtype t, sunrealtype c_j, N_Vector y, N_Vector yp,
               N_Vector r, SUNMatrix Jac, void* ida_mem, N_Vector tmp1,
               N_Vector tmp2, N_Vector tmp3)
{
  int retval;
  IDAMem IDA_mem;
  IDA_mem = (IDAMem)ida_mem;

  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }

  /* Verify that N_Vector supports required operations */
  if (IDA_mem->ida_tempv1->ops->nvcloneempty == NULL ||
      IDA_mem->ida_tempv1->ops->nvlinearsum == NULL ||
      IDA_mem->ida_tempv1->ops->nvdestroy == NULL ||
      IDA_mem->ida_tempv1->ops->nvscale == NULL ||
      IDA_mem->ida_tempv1->ops->nvgetarraypointer == NULL ||
      IDA_mem->ida_tempv1->ops->nvsetarraypointer == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = idaLsDenseDQJac(t, c_j, y, yp, r, Jac, IDA_mem, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = idaLsBandDQJac(t, c_j, y, yp, r, Jac, IDA_mem, tmp1, tmp2, tmp3);
  }
  else
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "unrecognized matrix type for idaLsDQJac");
    retval = IDA_ILL_INPUT;
  }
  return (retval);
}